

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O1

QRegularExpressionMatchIterator __thiscall
QRegularExpression::globalMatch
          (QRegularExpression *this,QString *subject,qsizetype offset,MatchType matchType,
          MatchOptions matchOptions)

{
  Data *pDVar1;
  QRegularExpressionPrivate *pQVar2;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  QRegularExpression local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QRegularExpressionPrivate *)operator_new(0x20);
  match(&local_40,subject,offset,matchType,matchOptions);
  (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)0x0;
  (pQVar2->pattern).d.d = (Data *)local_40.d.d.ptr;
  if (local_40.d.d.ptr != (totally_ordered_wrapper<QRegularExpressionPrivate_*>)0x0) {
    LOCK();
    *(int *)local_40.d.d.ptr = *(int *)local_40.d.d.ptr + 1;
    UNLOCK();
  }
  pDVar1 = (subject->d).d;
  (pQVar2->pattern).d.ptr = (char16_t *)pDVar1;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(QFlagsStorageHelper<QRegularExpression::MatchOption,_4> *)&(pQVar2->pattern).d.size =
       matchOptions.super_QFlagsStorageHelper<QRegularExpression::MatchOption,_4>.
       super_QFlagsStorage<QRegularExpression::MatchOption>.i;
  *(undefined4 *)((long)&(pQVar2->pattern).d.size + 4) = in_R9D;
  QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate> *)&local_40);
  (this->d).d.ptr = pQVar2;
  LOCK();
  (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)((int)(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
           (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QRegularExpressionMatchIterator QRegularExpression::globalMatch(const QString &subject,
                                                                qsizetype offset,
                                                                MatchType matchType,
                                                                MatchOptions matchOptions) const
{
    QRegularExpressionMatchIteratorPrivate *priv =
            new QRegularExpressionMatchIteratorPrivate(*this,
                                                       matchType,
                                                       matchOptions,
                                                       match(subject, offset, matchType, matchOptions));

    return QRegularExpressionMatchIterator(*priv);
}